

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueScanner::Flush(StringValueScanner *this,DataChunk *insert_chunk)

{
  CSVReaderOptions *pCVar1;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  optional_idx byte_position;
  optional_idx byte_position_00;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_01;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DataChunk *this_02;
  CSVErrorHandler *pCVar4;
  CSVFileScan *pCVar5;
  reference this_03;
  CSVBufferManager *pCVar6;
  CSVStateMachine *pCVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  mapped_type *pmVar10;
  CSVReaderOptions *pCVar11;
  pointer pcVar12;
  iterator iVar13;
  CSVBufferHandle *pCVar14;
  InvalidInputException *this_04;
  byte bVar15;
  LogicalTypeId type;
  idx_t entry_idx_1;
  string *__n;
  ulong uVar16;
  string *cast_error;
  shared_ptr<duckdb::CSVFileScan,_true> *this_05;
  idx_t iVar17;
  bool first_nl_1;
  idx_t line_error;
  string error_msg;
  __hashtable *__h;
  string borked_line;
  string error_message;
  bool first_nl;
  LinesPerBoundary lines_per_batch;
  vector<duckdb::Value,_true> row;
  UnifiedVectorFormat inserted_column_data;
  UnifiedVectorFormat parse_column_data;
  ostringstream error;
  undefined4 in_stack_fffffffffffffc0c;
  undefined7 in_stack_fffffffffffffc18;
  bool in_stack_fffffffffffffc1f;
  pointer local_3e0;
  StringValueScanner *local_3d8;
  LogicalType *local_3d0;
  reference local_3c8;
  string local_3c0;
  DataChunk *local_3a0;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_398;
  shared_ptr<duckdb::CSVStateMachine,_true> *local_390;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_388;
  shared_ptr<duckdb::CSVErrorHandler,_true> *local_380;
  string *local_378;
  unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  *local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_368;
  shared_ptr<duckdb::CSVFileScan,_true> *local_360;
  string local_358;
  string local_338;
  LinesPerBoundary local_318;
  LinesPerBoundary local_308;
  undefined8 local_2f8;
  undefined1 local_2e8 [48];
  undefined1 local_2b8 [32];
  _Alloc_hider local_298;
  char local_288 [48];
  shared_ptr<duckdb::CSVBufferHandle,_true> *local_258;
  shared_ptr<duckdb::CSVBufferManager,_true> *local_250;
  string *local_248;
  idx_t iStack_240;
  UnifiedVectorFormat local_238;
  UnifiedVectorFormat local_1f0;
  Value local_1a8;
  ios_base local_138 [264];
  
  local_380 = &(this->super_BaseScanner).error_handler;
  local_360 = &(this->super_BaseScanner).csv_file_scan;
  local_250 = &(this->super_BaseScanner).buffer_manager;
  local_390 = &(this->super_BaseScanner).state_machine;
  local_398 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&(this->result).line_positions_per_row;
  local_370 = &(this->result).buffer_handles;
  local_378 = &(this->result).path;
  local_388 = &(this->result).borked_rows._M_h;
  local_258 = &(this->super_BaseScanner).cur_buffer_handle;
  local_3d8 = this;
  local_3a0 = insert_chunk;
  do {
    iVar3 = (*(this->super_BaseScanner)._vptr_BaseScanner[2])(this);
    this_02 = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar3));
    DataChunk::Reset(local_3a0);
    pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_380);
    CSVErrorHandler::ErrorIfNeeded(pCVar4);
    this_05 = local_360;
    if (this_02->count == 0) {
      return;
    }
    local_3a0->count = this_02->count;
    pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(local_360);
    local_368 = CSVFileScan::GetNames_abi_cxx11_(pCVar5);
    pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_05);
    if ((pCVar5->super_BaseFileReader).column_ids.column_ids.
        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        .
        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar5->super_BaseFileReader).column_ids.column_ids.
        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        .
        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      cast_error = (string *)0x0;
      do {
        pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_05);
        __n = cast_error;
        if ((pCVar5->projection_ids).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pCVar5->projection_ids).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_05);
          __n = (string *)
                (pCVar5->projection_ids).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)cast_error].second;
        }
        if ((string *)
            (((long)(this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) <= cast_error) {
          this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_1a8.type_._0_8_ = (long)&local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a8,"Mismatch between the schema of different files","");
          InvalidInputException::InvalidInputException(this_04,(string *)&local_1a8);
          __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        local_3c8 = vector<duckdb::Vector,_true>::operator[](&this_02->data,(size_type)cast_error);
        this_03 = vector<duckdb::Vector,_true>::operator[](&local_3a0->data,(size_type)__n);
        local_3d0 = &this_03->type;
        bVar2 = LogicalType::IsJSONType(local_3d0);
        if (bVar2) {
LAB_00d07e82:
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          local_338._M_string_length = 0;
          local_338.field_2._M_local_buf[0] = '\0';
          local_3e0 = (pointer)0x0;
          pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(local_250);
          bVar2 = VectorOperations::TryCast
                            (pCVar6->context,local_3c8,this_03,this_02->count,&local_338,false,true)
          ;
          if (!bVar2) {
            UnifiedVectorFormat::UnifiedVectorFormat(&local_238);
            Vector::ToUnifiedFormat(this_03,this_02->count,&local_238);
            UnifiedVectorFormat::UnifiedVectorFormat(&local_1f0);
            Vector::ToUnifiedFormat(local_3c8,this_02->count,&local_1f0);
            for (; local_3e0 < (pointer)this_02->count; local_3e0 = local_3e0 + 1) {
              if (local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                  (unsigned_long *)0x0) {
                if (((local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [(ulong)local_3e0 >> 6] >> ((ulong)local_3e0 & 0x3f) & 1) == 0) &&
                   ((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                     (unsigned_long *)0x0 ||
                    ((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [(ulong)local_3e0 >> 6] & 1L << ((byte)local_3e0 & 0x3f)) != 0)))) break;
              }
            }
            pCVar7 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_390);
            if ((pCVar7->options->ignore_errors).value == true) {
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (element_type *)0x0;
              local_2e8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if ((this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  (this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                iVar17 = 0;
                do {
                  DataChunk::GetValue(&local_1a8,this_02,iVar17,(idx_t)local_3e0);
                  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
                  emplace_back<duckdb::Value>
                            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_2e8,
                             &local_1a8);
                  Value::~Value(&local_1a8);
                  iVar17 = iVar17 + 1;
                } while (iVar17 < (ulong)(((long)(this_02->data).
                                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 .
                                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this_02->data).
                                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 .
                                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                         0x4ec4ec4ec4ec4ec5));
              }
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_2e8);
            }
            pCVar7 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_390);
            bVar2 = CSVReaderOptions::IgnoreErrors(pCVar7->options);
            if (!bVar2) {
              LinesPerBoundary::LinesPerBoundary
                        (&local_308,(local_3d8->super_BaseScanner).iterator.boundary.boundary_idx,
                         (idx_t)(local_3e0 +
                                ((local_3d8->super_BaseScanner).lines_read - this_02->count)));
              local_318.boundary_idx._0_1_ = 0;
              pmVar8 = ::std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_398,(key_type *)&local_3e0);
              if ((local_3d8->result).super_ScannerResult.result_size == 1) {
                bVar15 = false;
              }
              else {
                pCVar1 = ((local_3d8->result).super_ScannerResult.state_machine)->options;
                bVar15 = true;
                if ((pCVar1->store_rejects).value == false) {
                  bVar15 = (pCVar1->ignore_errors).value ^ 1;
                }
              }
              FullLinePosition::
              ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                        (&local_358,pmVar8,(bool *)&local_318,local_370,(bool)bVar15);
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"Could not convert string \"",0x1a);
              Vector::GetValue((Value *)local_2e8,local_3c8,(idx_t)local_3e0);
              poVar9 = duckdb::operator<<((ostream *)&local_1a8,(Value *)local_2e8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" to \'",6);
              LogicalType::ToString_abi_cxx11_(&local_3c0,local_3d0);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                operator_delete(local_3c0._M_dataplus._M_p);
              }
              Value::~Value((Value *)local_2e8);
              ::std::__cxx11::stringbuf::str();
              FullLinePosition::SanitizeError(&local_3c0);
              this_00 = local_398;
              pmVar8 = ::std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_398,(key_type *)&local_3e0);
              pmVar10 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](this_00,(key_type *)&local_3e0);
              if ((((pmVar8->begin).buffer_pos == (pmVar10->end).buffer_pos) &&
                  ((pmVar8->begin).buffer_idx == (pmVar10->end).buffer_idx)) &&
                 ((pmVar8->begin).buffer_size == (pmVar10->end).buffer_size)) {
                iVar17 = 0;
              }
              else {
                pmVar8 = ::std::__detail::
                         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[](local_398,(key_type *)&local_3e0);
                iVar17 = (ulong)(byte)local_318.boundary_idx + (pmVar8->begin).buffer_pos +
                         (pmVar8->begin).buffer_idx *
                         (local_3d8->result).super_ScannerResult.result_size;
              }
              pCVar7 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_390);
              pCVar1 = pCVar7->options;
              pCVar11 = (CSVReaderOptions *)
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::operator[](local_368,(size_type)cast_error);
              error_info.lines_in_batch = iVar17;
              error_info.boundary_idx = local_308.lines_in_batch;
              byte_position.index._4_4_ = in_stack_fffffffffffffc0c;
              byte_position.index._0_4_ = (uint)local_3d0->id_;
              CSVError::CastError((CSVError *)local_2e8,(CSVError *)pCVar1,pCVar11,&local_3c0,
                                  cast_error,(idx_t)&local_358,(string *)local_308.boundary_idx,
                                  error_info,0xffffffffffffffff,byte_position,
                                  (LogicalTypeId)local_378,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
              pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_380);
              CSVErrorHandler::Error(pCVar4,(CSVError *)local_2e8,false);
              if (local_298._M_p != local_288) {
                operator_delete(local_298._M_p);
              }
              if ((undefined1 *)local_2e8._32_8_ != local_2b8) {
                operator_delete((void *)local_2e8._32_8_);
              }
              if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                operator_delete((void *)local_2e8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                operator_delete(local_3c0._M_dataplus._M_p);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              ::std::ios_base::~ios_base(local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p);
              }
            }
            local_2e8._0_8_ = local_3e0;
            local_1a8.type_._0_8_ = local_388;
            local_3e0 = local_3e0 + 1;
            ::std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_388,local_2e8,&local_1a8);
            pcVar12 = (pointer)this_02->count;
            for (; local_3e0 < pcVar12; local_3e0 = local_3e0 + 1) {
              if (local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                  (unsigned_long *)0x0) {
                if (((local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [(ulong)local_3e0 >> 6] >> ((ulong)local_3e0 & 0x3f) & 1) == 0) &&
                   ((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                     (unsigned_long *)0x0 ||
                    ((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [(ulong)local_3e0 >> 6] & 1L << ((byte)local_3e0 & 0x3f)) != 0)))) {
                  local_1a8.type_._0_8_ = local_388;
                  ::std::
                  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_388,&local_3e0,&local_1a8);
                  local_308.boundary_idx = 0;
                  local_308.lines_in_batch = 0;
                  local_2f8 = 0;
                  if ((this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    iVar17 = 0;
                    do {
                      DataChunk::GetValue(&local_1a8,this_02,iVar17,(idx_t)local_3e0);
                      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
                      emplace_back<duckdb::Value>
                                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_308
                                 ,&local_1a8);
                      Value::~Value(&local_1a8);
                      iVar17 = iVar17 + 1;
                    } while (iVar17 < (ulong)(((long)(this_02->data).
                                                                                                          
                                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  .
                                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this_02->data).
                                                                                                          
                                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  .
                                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                             0x4ec4ec4ec4ec4ec5));
                  }
                  pCVar7 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_390);
                  bVar2 = CSVReaderOptions::IgnoreErrors(pCVar7->options);
                  if (!bVar2) {
                    LinesPerBoundary::LinesPerBoundary
                              (&local_318,
                               (local_3d8->super_BaseScanner).iterator.boundary.boundary_idx,
                               (idx_t)(local_3e0 +
                                      ((local_3d8->super_BaseScanner).lines_read - this_02->count)))
                    ;
                    in_stack_fffffffffffffc1f = false;
                    pmVar8 = ::std::__detail::
                             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[](local_398,(key_type *)&local_3e0);
                    if ((local_3d8->result).super_ScannerResult.result_size == 1) {
                      bVar15 = false;
                    }
                    else {
                      pCVar1 = ((local_3d8->result).super_ScannerResult.state_machine)->options;
                      bVar15 = true;
                      if ((pCVar1->store_rejects).value == false) {
                        bVar15 = (pCVar1->ignore_errors).value ^ 1;
                      }
                    }
                    FullLinePosition::
                    ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                              (&local_358,pmVar8,(bool *)&stack0xfffffffffffffc1f,local_370,
                               (bool)bVar15);
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_1a8,"Could not convert string \"",0x1a);
                    Vector::GetValue((Value *)local_2e8,local_3c8,(idx_t)local_3e0);
                    poVar9 = duckdb::operator<<((ostream *)&local_1a8,(Value *)local_2e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" to \'",6);
                    LogicalTypeIdToString_abi_cxx11_
                              (&local_3c0,(duckdb *)(ulong)local_3d0->id_,type);
                    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,local_3c0._M_dataplus._M_p,local_3c0._M_string_length
                                       );
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                      operator_delete(local_3c0._M_dataplus._M_p);
                    }
                    Value::~Value((Value *)local_2e8);
                    ::std::__cxx11::stringbuf::str();
                    FullLinePosition::SanitizeError(&local_3c0);
                    pCVar7 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_390);
                    pCVar1 = pCVar7->options;
                    pCVar11 = (CSVReaderOptions *)
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ::operator[](local_368,(size_type)cast_error);
                    local_248 = (string *)
                                CONCAT71(local_318.boundary_idx._1_7_,(byte)local_318.boundary_idx);
                    iStack_240 = local_318.lines_in_batch;
                    pmVar8 = ::std::__detail::
                             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[](local_398,(key_type *)&local_3e0);
                    error_info_00.lines_in_batch =
                         (ulong)in_stack_fffffffffffffc1f + (pmVar8->begin).buffer_pos +
                         (pmVar8->begin).buffer_idx *
                         (local_3d8->result).super_ScannerResult.result_size;
                    error_info_00.boundary_idx = iStack_240;
                    byte_position_00.index._4_4_ = in_stack_fffffffffffffc0c;
                    byte_position_00.index._0_4_ = (uint)local_3d0->id_;
                    CSVError::CastError((CSVError *)local_2e8,(CSVError *)pCVar1,pCVar11,&local_3c0,
                                        cast_error,(idx_t)&local_358,local_248,error_info_00,
                                        0xffffffffffffffff,byte_position_00,(LogicalTypeId)local_378
                                        ,(string *)
                                         CONCAT17(in_stack_fffffffffffffc1f,
                                                  in_stack_fffffffffffffc18));
                    pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_380);
                    CSVErrorHandler::Error(pCVar4,(CSVError *)local_2e8,false);
                    if (local_298._M_p != local_288) {
                      operator_delete(local_298._M_p);
                    }
                    if ((undefined1 *)local_2e8._32_8_ != local_2b8) {
                      operator_delete((void *)local_2e8._32_8_);
                    }
                    if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                      operator_delete((void *)local_2e8._0_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                      operator_delete(local_3c0._M_dataplus._M_p);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_358._M_dataplus._M_p != &local_358.field_2) {
                      operator_delete(local_358._M_dataplus._M_p);
                    }
                  }
                  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_308);
                  pcVar12 = (pointer)this_02->count;
                }
              }
            }
            if (local_1f0.owned_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1f0.owned_sel.selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_238.owned_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_238.owned_sel.selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p);
          }
        }
        else {
          LogicalType::LogicalType(&local_1a8.type_,VARCHAR);
          bVar2 = LogicalType::operator==(local_3d0,&local_1a8.type_);
          if (!bVar2) {
            LogicalType::LogicalType((LogicalType *)local_2e8,VARCHAR);
            bVar2 = LogicalType::operator==(local_3d0,(LogicalType *)local_2e8);
            if (bVar2) {
              LogicalType::~LogicalType((LogicalType *)local_2e8);
              LogicalType::~LogicalType(&local_1a8.type_);
            }
            else {
              LogicalType::LogicalType((LogicalType *)&local_238,VARCHAR);
              bVar2 = LogicalType::operator==(&local_3c8->type,(LogicalType *)&local_238);
              LogicalType::~LogicalType((LogicalType *)&local_238);
              LogicalType::~LogicalType((LogicalType *)local_2e8);
              LogicalType::~LogicalType(&local_1a8.type_);
              if (!bVar2) goto LAB_00d080b3;
            }
            goto LAB_00d07e82;
          }
          LogicalType::~LogicalType(&local_1a8.type_);
LAB_00d080b3:
          Vector::Reinterpret(this_03,local_3c8);
        }
        this_05 = local_360;
        cast_error = (string *)((long)&(cast_error->_M_dataplus)._M_p + 1);
        pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(local_360);
      } while (cast_error <
               (string *)
               ((long)(pCVar5->super_BaseFileReader).column_ids.column_ids.
                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      .
                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar5->super_BaseFileReader).column_ids.column_ids.
                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      .
                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    this_01 = local_258;
    this = local_3d8;
    if ((local_3d8->result).borked_rows._M_h._M_element_count != 0) {
      SelectionVector::SelectionVector((SelectionVector *)&local_1a8,this_02->count);
      local_2e8._0_8_ = (pointer)0x0;
      if (this_02->count == 0) {
        iVar17 = 0;
      }
      else {
        iVar17 = 0;
        do {
          iVar13 = ::std::
                   _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_388,(key_type *)local_2e8);
          if (iVar13.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
            *(int *)(local_1a8.type_._0_8_ + iVar17 * 4) = (int)local_2e8._0_8_;
            iVar17 = iVar17 + 1;
          }
          local_2e8._0_8_ = local_2e8._0_8_ + 1;
        } while ((ulong)local_2e8._0_8_ < (pointer)this_02->count);
      }
      DataChunk::Slice(local_3a0,(SelectionVector *)&local_1a8,iVar17);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear(local_388);
      if (local_1a8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    if (local_3a0->count != 0) {
      return;
    }
    if ((this_01->internal).super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      return;
    }
    if ((this->super_BaseScanner).iterator.is_set == true) {
      uVar16 = (this->super_BaseScanner).iterator.boundary.end_pos;
      pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
      if (pCVar14->actual_size < uVar16) goto LAB_00d089a8;
    }
    else {
LAB_00d089a8:
      pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
      uVar16 = pCVar14->actual_size;
    }
    if (uVar16 <= (this->super_BaseScanner).iterator.pos.buffer_pos) {
      return;
    }
  } while( true );
}

Assistant:

void StringValueScanner::Flush(DataChunk &insert_chunk) {
	bool continue_processing;
	do {
		continue_processing = false;
		auto &process_result = ParseChunk();
		// First Get Parsed Chunk
		auto &parse_chunk = process_result.ToChunk();
		insert_chunk.Reset();
		// We have to check if we got to error
		error_handler->ErrorIfNeeded();
		if (parse_chunk.size() == 0) {
			return;
		}
		// convert the columns in the parsed chunk to the types of the table
		insert_chunk.SetCardinality(parse_chunk);

		// We keep track of the borked lines, in case we are ignoring errors
		D_ASSERT(csv_file_scan);

		auto &names = csv_file_scan->GetNames();
		// Now Do the cast-aroo
		for (idx_t i = 0; i < csv_file_scan->column_ids.size(); i++) {
			idx_t result_idx = i;
			if (!csv_file_scan->projection_ids.empty()) {
				result_idx = csv_file_scan->projection_ids[i].second;
			}
			if (i >= parse_chunk.ColumnCount()) {
				throw InvalidInputException("Mismatch between the schema of different files");
			}
			auto &parse_vector = parse_chunk.data[i];
			auto &result_vector = insert_chunk.data[result_idx];
			auto &type = result_vector.GetType();
			auto &parse_type = parse_vector.GetType();
			if (!type.IsJSONType() && (type == LogicalType::VARCHAR ||
			                           (type != LogicalType::VARCHAR && parse_type != LogicalType::VARCHAR))) {
				// reinterpret rather than reference
				result_vector.Reinterpret(parse_vector);
			} else {
				string error_message;
				idx_t line_error = 0;
				if (VectorOperations::TryCast(buffer_manager->context, parse_vector, result_vector, parse_chunk.size(),
				                              &error_message, false, true)) {
					continue;
				}
				// An error happened, to propagate it we need to figure out the exact line where the casting failed.
				UnifiedVectorFormat inserted_column_data;
				result_vector.ToUnifiedFormat(parse_chunk.size(), inserted_column_data);
				UnifiedVectorFormat parse_column_data;
				parse_vector.ToUnifiedFormat(parse_chunk.size(), parse_column_data);

				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						break;
					}
				}
				{
					if (state_machine->options.ignore_errors.GetValue()) {
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
					}
					if (!state_machine->options.IgnoreErrors()) {
						LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
						                                 lines_read - parse_chunk.size() + line_error);
						bool first_nl = false;
						auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
						    first_nl, result.buffer_handles, result.PrintErrorLine());
						std::ostringstream error;
						error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
						      << type.ToString() << "\'";
						string error_msg = error.str();
						FullLinePosition::SanitizeError(error_msg);
						idx_t row_byte_pos = 0;
						if (!(result.line_positions_per_row[line_error].begin ==
						      result.line_positions_per_row[line_error].end)) {
							row_byte_pos = result.line_positions_per_row[line_error].begin.GetGlobalPosition(
							    result.result_size, first_nl);
						}
						auto csv_error = CSVError::CastError(
						    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch, row_byte_pos,
						    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
						error_handler->Error(csv_error);
					}
				}
				result.borked_rows.insert(line_error++);
				D_ASSERT(state_machine->options.ignore_errors.GetValue());
				// We are ignoring errors. We must continue but ignoring borked-rows
				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						result.borked_rows.insert(line_error);
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
						if (!state_machine->options.IgnoreErrors()) {
							LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
							                                 lines_read - parse_chunk.size() + line_error);
							bool first_nl = false;
							auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
							    first_nl, result.buffer_handles, result.PrintErrorLine());
							std::ostringstream error;
							// Casting Error Message
							error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
							      << LogicalTypeIdToString(type.id()) << "\'";
							string error_msg = error.str();
							FullLinePosition::SanitizeError(error_msg);
							auto csv_error = CSVError::CastError(
							    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch,
							    result.line_positions_per_row[line_error].begin.GetGlobalPosition(result.result_size,
							                                                                      first_nl),
							    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
							error_handler->Error(csv_error);
						}
					}
				}
			}
		}
		if (!result.borked_rows.empty()) {
			// We must remove the borked lines from our chunk
			SelectionVector successful_rows(parse_chunk.size());
			idx_t sel_idx = 0;
			for (idx_t row_idx = 0; row_idx < parse_chunk.size(); row_idx++) {
				if (result.borked_rows.find(row_idx) == result.borked_rows.end()) {
					successful_rows.set_index(sel_idx++, row_idx);
				}
			}
			// Now we slice the result
			insert_chunk.Slice(successful_rows, sel_idx);
			result.borked_rows.clear();
		}
		if (insert_chunk.size() == 0 && cur_buffer_handle) {
			idx_t to_pos;
			if (iterator.IsBoundarySet()) {
				to_pos = iterator.GetEndPos();
				if (to_pos > cur_buffer_handle->actual_size) {
					to_pos = cur_buffer_handle->actual_size;
				}
			} else {
				to_pos = cur_buffer_handle->actual_size;
			}
			if (iterator.pos.buffer_pos < to_pos) {
				// If a chunk is complete with errors, we might get to this situation where we must proceed with the
				// scanning
				continue_processing = true;
			}
		}
	} while (continue_processing);
}